

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O3

void __thiscall
Eigen::PermutationMatrix<-1,-1,int>::
PermutationMatrix<Eigen::PermutationMatrix<_1,_1,int>,Eigen::PermutationMatrix<_1,_1,int>>
          (PermutationMatrix<_1,_1,int> *this,PermPermProduct_t param_1,
          PermutationMatrix<_1,__1,_int> *lhs,PermutationMatrix<_1,__1,_int> *rhs)

{
  ulong uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  
  uVar1 = (lhs->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (uVar1 != 0) {
    if (uVar1 >> 0x3e == 0) {
      pvVar2 = malloc(uVar1 * 4);
      if (pvVar2 != (void *)0x0) goto LAB_0014d460;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = std::streambuf::xsgetn;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  pvVar2 = (void *)0x0;
LAB_0014d460:
  *(void **)this = pvVar2;
  *(ulong *)(this + 8) = uVar1;
  PermutationBase<Eigen::PermutationMatrix<-1,-1,int>>::
  assignProduct<Eigen::PermutationMatrix<_1,_1,int>,Eigen::PermutationMatrix<_1,_1,int>>
            ((PermutationBase<Eigen::PermutationMatrix<_1,_1,int>> *)this,lhs,rhs);
  return;
}

Assistant:

PermutationMatrix(internal::PermPermProduct_t, const Lhs& lhs, const Rhs& rhs)
      : m_indices(lhs.indices().size())
    {
      Base::assignProduct(lhs,rhs);
    }